

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O1

void __thiscall OpenMD::NPrT::loadEta(NPrT *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  Mat3x3d local_58;
  
  Snapshot::getBarostat
            (&local_58,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  if (&this->eta != &local_58) {
    lVar3 = 0;
    do {
      *(undefined8 *)
       ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar3 + 0x10) =
           *(undefined8 *)
            ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar3 + 0x10);
      uVar2 = *(undefined8 *)
               ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar3 + 8);
      puVar1 = (undefined8 *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar3);
      *puVar1 = *(undefined8 *)
                 ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar3);
      puVar1[1] = uVar2;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x48);
  }
  return;
}

Assistant:

void NPrT::loadEta() {
    eta = snap->getBarostat();

    // if (!eta.isDiagonal()) {
    //    snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
    //             "NPrT error: the diagonal elements of eta matrix are not the
    //             same or etaMat is not a diagonal matrix");
    //    painCave.isFatal = 1;
    //    simError();
    //}
  }